

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

bool __thiscall Table::in_key(Table *this,string *key)

{
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  _Rb_tree_header *p_Var2;
  
  p_Var2 = &(this->keyWords)._M_t._M_impl.super__Rb_tree_header;
  _Var1 = std::
          __find_if<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->keyWords)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,
                     key);
  return (_Rb_tree_header *)_Var1._M_node != p_Var2;
}

Assistant:

bool Table::in_key(const std::string &key) {
    return std::find(keyWords.begin(), keyWords.end(), key) != keyWords.end();
}